

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O0

bool wasm::anon_unknown_0::shapeEq(HeapType a,HeapType b)

{
  bool bVar1;
  Struct *a_00;
  Struct *b_00;
  Signature a_01;
  Signature b_01;
  Array local_40;
  Array local_30;
  HeapType local_20;
  HeapType b_local;
  HeapType a_local;
  
  local_20.id = b.id;
  b_local = a;
  bVar1 = HeapType::isStruct(&b_local);
  if ((bVar1) && (bVar1 = HeapType::isStruct(&local_20), bVar1)) {
    a_00 = HeapType::getStruct(&b_local);
    b_00 = HeapType::getStruct(&local_20);
    a_local.id._7_1_ = shapeEq(a_00,b_00);
  }
  else {
    bVar1 = HeapType::isArray(&b_local);
    if ((bVar1) && (bVar1 = HeapType::isArray(&local_20), bVar1)) {
      HeapType::getArray((HeapType *)&local_30);
      HeapType::getArray((HeapType *)&local_40);
      a_local.id._7_1_ = shapeEq(&local_30,&local_40);
    }
    else {
      bVar1 = HeapType::isSignature(&b_local);
      if ((bVar1) && (bVar1 = HeapType::isSignature(&local_20), bVar1)) {
        a_01 = HeapType::getSignature(&b_local);
        b_01 = HeapType::getSignature(&local_20);
        a_local.id._7_1_ = shapeEq(a_01,b_01);
      }
      else {
        a_local.id._7_1_ = false;
      }
    }
  }
  return a_local.id._7_1_;
}

Assistant:

bool shapeEq(HeapType a, HeapType b) {
  // Check whether `a` and `b` have the same top-level structure, including the
  // position and identity of any children that are not included as transitions
  // in the DFA, i.e. any children that are not nontrivial references.
  if (a.isStruct() && b.isStruct()) {
    return shapeEq(a.getStruct(), b.getStruct());
  }
  if (a.isArray() && b.isArray()) {
    return shapeEq(a.getArray(), b.getArray());
  }
  if (a.isSignature() && b.isSignature()) {
    return shapeEq(a.getSignature(), b.getSignature());
  }
  return false;
}